

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-fork.c
# Opt level: O3

int run_test_fork_timer(void)

{
  __pid_t _Var1;
  int iVar2;
  uint uVar3;
  uint child_pid;
  undefined8 uVar4;
  undefined1 *puVar5;
  ssize_t sVar6;
  undefined1 *puVar7;
  uint extraout_EDX;
  undefined8 unaff_RBX;
  uint uVar8;
  undefined1 *puVar9;
  undefined1 uStack_261;
  int iStack_260;
  int iStack_25c;
  int iStack_258;
  int iStack_254;
  undefined1 auStack_250 [160];
  code *pcStack_1b0;
  undefined1 *puStack_1a0;
  code *pcStack_198;
  int iStack_188;
  uint uStack_184;
  undefined1 auStack_180 [160];
  code *pcStack_e0;
  uint uStack_cc;
  undefined1 *puStack_c8;
  undefined1 auStack_a8 [152];
  code *pcStack_10;
  
  pcStack_10 = (code *)0x14ec9e;
  run_timer_loop_once();
  pcStack_10 = (code *)0x14eca3;
  _Var1 = fork();
  if (_Var1 == 0) {
    pcStack_10 = (code *)0x14ecba;
    uVar4 = uv_default_loop();
    pcStack_10 = (code *)0x14ecc2;
    iVar2 = uv_loop_fork(uVar4);
    if (iVar2 == 0) {
      pcStack_10 = (code *)0x14eccb;
      run_timer_loop_once();
      goto LAB_0014eccb;
    }
  }
  else {
    if (_Var1 != -1) {
      pcStack_10 = (code *)0x14ecb3;
      assert_wait_child(_Var1);
LAB_0014eccb:
      pcStack_10 = (code *)0x14ecd0;
      unaff_RBX = uv_default_loop();
      pcStack_10 = (code *)0x14ece4;
      uv_walk(unaff_RBX,close_walk_cb,0);
      pcStack_10 = (code *)0x14ecee;
      uv_run(unaff_RBX,0);
      pcStack_10 = (code *)0x14ecf3;
      uVar4 = uv_default_loop();
      pcStack_10 = (code *)0x14ecfb;
      iVar2 = uv_loop_close(uVar4);
      if (iVar2 == 0) {
        return 0;
      }
      pcStack_10 = (code *)0x14ed08;
      run_test_fork_timer_cold_3();
    }
    pcStack_10 = (code *)0x14ed0d;
    run_test_fork_timer_cold_2();
  }
  pcStack_10 = run_timer_loop_once;
  run_test_fork_timer_cold_1();
  pcStack_10 = (code *)unaff_RBX;
  puVar5 = (undefined1 *)uv_default_loop();
  timer_cb_called = 0;
  puVar9 = puVar5;
  iVar2 = uv_timer_init(puVar5,auStack_a8);
  if (iVar2 == 0) {
    puVar9 = auStack_a8;
    iVar2 = uv_timer_start(puVar9,timer_cb,1,0);
    if (iVar2 != 0) goto LAB_0014ed7e;
    puVar9 = puVar5;
    iVar2 = uv_run(puVar5,0);
    if (iVar2 != 0) goto LAB_0014ed83;
    if (timer_cb_called == 1) {
      return 0;
    }
  }
  else {
    run_timer_loop_once_cold_1();
LAB_0014ed7e:
    run_timer_loop_once_cold_2();
LAB_0014ed83:
    run_timer_loop_once_cold_3();
  }
  run_timer_loop_once_cold_4();
  puVar7 = (undefined1 *)((ulong)puVar9 & 0xffffffff);
  pcStack_e0 = (code *)0x14eda6;
  puStack_c8 = puVar5;
  uVar3 = waitpid((uint)puVar9,(int *)&uStack_cc,0);
  pcStack_e0 = (code *)0x14edbb;
  printf("Waited pid is %d with status %d\n",(ulong)uVar3,(ulong)uStack_cc);
  if (uVar3 == 0xffffffff) {
    pcStack_e0 = (code *)0x14ede8;
    perror("Failed to wait");
  }
  if (uVar3 == (uint)puVar9) {
    if ((uStack_cc & 0x7f) != 0) goto LAB_0014edef;
    if ((uStack_cc & 0xff00) == 0) {
      return uStack_cc;
    }
  }
  else {
    pcStack_e0 = (code *)0x14edef;
    assert_wait_child_cold_1();
LAB_0014edef:
    pcStack_e0 = (code *)0x14edf4;
    assert_wait_child_cold_2();
  }
  pcStack_e0 = run_test_fork_socketpair;
  assert_wait_child_cold_3();
  pcStack_198 = (code *)0x14ee06;
  pcStack_e0 = (code *)puVar7;
  run_timer_loop_once();
  puVar9 = (undefined1 *)0x1;
  uVar8 = 1;
  pcStack_198 = (code *)0x14ee1c;
  iVar2 = socketpair(1,1,0,&iStack_188);
  if (iVar2 == 0) {
    pcStack_198 = (code *)0x14ee29;
    puVar9 = (undefined1 *)uv_default_loop();
    puVar5 = auStack_180;
    pcStack_198 = (code *)0x14ee3a;
    iVar2 = uv_poll_init(puVar9,puVar5,iStack_188);
    uVar8 = (uint)puVar5;
    if (iVar2 != 0) goto LAB_0014ef2c;
    pcStack_198 = (code *)0x14ee47;
    child_pid = fork();
    if (child_pid != 0) {
      puVar7 = (undefined1 *)(ulong)child_pid;
      if (child_pid == 0xffffffff) goto LAB_0014ef36;
      puVar9 = (undefined1 *)(ulong)uStack_184;
      uVar8 = 0x18271a;
      pcStack_198 = (code *)0x14ee6d;
      sVar6 = send(uStack_184,"hi\n",3,0);
      if (sVar6 == 3) {
        pcStack_198 = (code *)0x14ee7e;
        assert_wait_child(child_pid);
LAB_0014eee8:
        pcStack_198 = (code *)0x14eeed;
        puVar7 = (undefined1 *)uv_default_loop();
        pcStack_198 = (code *)0x14ef01;
        uv_walk(puVar7,close_walk_cb,0);
        uVar8 = 0;
        pcStack_198 = (code *)0x14ef0b;
        uv_run(puVar7);
        pcStack_198 = (code *)0x14ef10;
        puVar9 = (undefined1 *)uv_default_loop();
        pcStack_198 = (code *)0x14ef18;
        iVar2 = uv_loop_close();
        if (iVar2 == 0) {
          return 0;
        }
        goto LAB_0014ef31;
      }
      goto LAB_0014ef3b;
    }
    pcStack_198 = (code *)0x14ee85;
    puVar9 = (undefined1 *)uv_default_loop();
    pcStack_198 = (code *)0x14ee8d;
    iVar2 = uv_loop_fork();
    if (iVar2 != 0) goto LAB_0014ef40;
    if (socket_cb_called != 0) goto LAB_0014ef45;
    puVar9 = auStack_180;
    uVar8 = 1;
    pcStack_198 = (code *)0x14eeb8;
    iVar2 = uv_poll_start(puVar9,1,socket_cb);
    if (iVar2 != 0) goto LAB_0014ef4a;
    pcStack_198 = (code *)0x14eecc;
    puts("Going to run the loop in the child");
    pcStack_198 = (code *)0x14eed1;
    puVar9 = (undefined1 *)uv_default_loop();
    uVar8 = 0;
    pcStack_198 = (code *)0x14eedb;
    iVar2 = uv_run();
    if (iVar2 != 0) goto LAB_0014ef4f;
    if (socket_cb_called == 1) goto LAB_0014eee8;
  }
  else {
    pcStack_198 = (code *)0x14ef2c;
    run_test_fork_socketpair_cold_1();
LAB_0014ef2c:
    pcStack_198 = (code *)0x14ef31;
    run_test_fork_socketpair_cold_2();
LAB_0014ef31:
    pcStack_198 = (code *)0x14ef36;
    run_test_fork_socketpair_cold_10();
LAB_0014ef36:
    pcStack_198 = (code *)0x14ef3b;
    run_test_fork_socketpair_cold_8();
LAB_0014ef3b:
    pcStack_198 = (code *)0x14ef40;
    run_test_fork_socketpair_cold_9();
LAB_0014ef40:
    pcStack_198 = (code *)0x14ef45;
    run_test_fork_socketpair_cold_3();
LAB_0014ef45:
    pcStack_198 = (code *)0x14ef4a;
    run_test_fork_socketpair_cold_4();
LAB_0014ef4a:
    pcStack_198 = (code *)0x14ef4f;
    run_test_fork_socketpair_cold_5();
LAB_0014ef4f:
    pcStack_198 = (code *)0x14ef54;
    run_test_fork_socketpair_cold_6();
  }
  pcStack_198 = socket_cb;
  run_test_fork_socketpair_cold_7();
  socket_cb_called = socket_cb_called + 1;
  puStack_1a0 = puVar7;
  pcStack_198 = (code *)(ulong)uVar3;
  if (uVar8 == 0) {
    pcStack_1b0 = (code *)0x14ef7b;
    uVar8 = extraout_EDX;
    printf("Socket cb got events %d\n");
    puVar7 = puVar9;
    if ((extraout_EDX & 1) == 0) goto LAB_0014efc7;
    if (socket_cb_read_fd == 0) {
LAB_0014efb2:
      iVar2 = uv_close(puVar9,0);
      return iVar2;
    }
    uVar8 = 0x2e0290;
    pcStack_1b0 = (code *)0x14efa2;
    sVar6 = read(socket_cb_read_fd,socket_cb_read_buf,(ulong)socket_cb_read_size * 3);
    if (sVar6 == (ulong)socket_cb_read_size * 3) goto LAB_0014efb2;
  }
  else {
    pcStack_1b0 = (code *)0x14efc7;
    socket_cb_cold_1();
LAB_0014efc7:
    pcStack_1b0 = (code *)0x14efcc;
    socket_cb_cold_3();
  }
  pcStack_1b0 = run_test_fork_socketpair_started;
  socket_cb_cold_2();
  pcStack_1b0 = (code *)puVar7;
  iVar2 = pipe(&iStack_258);
  if (iVar2 == 0) {
    run_timer_loop_once();
    uVar8 = 1;
    iVar2 = socketpair(1,1,0,&iStack_260);
    if (iVar2 != 0) goto LAB_0014f22d;
    uVar4 = uv_default_loop();
    puVar9 = auStack_250;
    iVar2 = uv_poll_init(uVar4,puVar9,iStack_260);
    uVar8 = (uint)puVar9;
    if (iVar2 != 0) goto LAB_0014f232;
    uVar8 = 1;
    iVar2 = uv_poll_start(auStack_250,1,socket_cb);
    if (iVar2 != 0) goto LAB_0014f237;
    uVar4 = uv_default_loop();
    uVar8 = 2;
    iVar2 = uv_run(uVar4);
    if (iVar2 != 1) goto LAB_0014f23c;
    _Var1 = fork();
    if (_Var1 != 0) {
      if (_Var1 == -1) goto LAB_0014f246;
      iVar2 = uv_poll_stop(auStack_250);
      if (iVar2 != 0) goto LAB_0014f24b;
      uv_close(auStack_250);
      uVar4 = uv_default_loop();
      uVar8 = 0;
      iVar2 = uv_run(uVar4);
      if (iVar2 != 0) goto LAB_0014f255;
      if (socket_cb_called != 0) goto LAB_0014f25f;
      uVar8 = 0x18323c;
      sVar6 = write(iStack_254,"1",1);
      if (sVar6 != 1) goto LAB_0014f269;
      uVar8 = 0x18271a;
      sVar6 = send(iStack_25c,"hi\n",3,0);
      if (sVar6 != 3) goto LAB_0014f273;
      uVar4 = uv_default_loop();
      uVar8 = 0;
      iVar2 = uv_run(uVar4);
      if (iVar2 == 0) {
        if (socket_cb_called != 0) goto LAB_0014f287;
        assert_wait_child(_Var1);
        goto LAB_0014f1e9;
      }
      goto LAB_0014f27d;
    }
    uVar3 = getpid();
    printf("Child is %d\n",(ulong)uVar3);
    puVar9 = &uStack_261;
    sVar6 = read(iStack_258,puVar9,1);
    uVar8 = (uint)puVar9;
    if (sVar6 != 1) goto LAB_0014f250;
    uVar4 = uv_default_loop();
    iVar2 = uv_loop_fork(uVar4);
    if (iVar2 != 0) goto LAB_0014f25a;
    if (socket_cb_called != 0) goto LAB_0014f264;
    puts("Going to run the loop in the child");
    socket_cb_read_fd = iStack_260;
    socket_cb_read_size = 1;
    uVar4 = uv_default_loop();
    uVar8 = 0;
    iVar2 = uv_run(uVar4);
    if (iVar2 != 0) goto LAB_0014f26e;
    if (socket_cb_called != 1) goto LAB_0014f278;
    uVar8 = 0x2e0290;
    printf("Buf %s\n");
    if (socket_cb_read_buf._0_4_ == 0xa6968) {
LAB_0014f1e9:
      uVar4 = uv_default_loop();
      uv_walk(uVar4,close_walk_cb,0);
      uVar8 = 0;
      uv_run(uVar4);
      uVar4 = uv_default_loop();
      iVar2 = uv_loop_close(uVar4);
      if (iVar2 == 0) {
        return 0;
      }
      goto LAB_0014f241;
    }
  }
  else {
    run_test_fork_socketpair_started_cold_1();
LAB_0014f22d:
    run_test_fork_socketpair_started_cold_2();
LAB_0014f232:
    run_test_fork_socketpair_started_cold_3();
LAB_0014f237:
    run_test_fork_socketpair_started_cold_4();
LAB_0014f23c:
    run_test_fork_socketpair_started_cold_5();
LAB_0014f241:
    run_test_fork_socketpair_started_cold_20();
LAB_0014f246:
    run_test_fork_socketpair_started_cold_12();
LAB_0014f24b:
    run_test_fork_socketpair_started_cold_13();
LAB_0014f250:
    run_test_fork_socketpair_started_cold_6();
LAB_0014f255:
    run_test_fork_socketpair_started_cold_14();
LAB_0014f25a:
    run_test_fork_socketpair_started_cold_7();
LAB_0014f25f:
    run_test_fork_socketpair_started_cold_15();
LAB_0014f264:
    run_test_fork_socketpair_started_cold_8();
LAB_0014f269:
    run_test_fork_socketpair_started_cold_16();
LAB_0014f26e:
    run_test_fork_socketpair_started_cold_9();
LAB_0014f273:
    run_test_fork_socketpair_started_cold_17();
LAB_0014f278:
    run_test_fork_socketpair_started_cold_10();
LAB_0014f27d:
    run_test_fork_socketpair_started_cold_18();
  }
  run_test_fork_socketpair_started_cold_11();
LAB_0014f287:
  run_test_fork_socketpair_started_cold_19();
  fork_signal_cb_called = uVar8;
  iVar2 = uv_close();
  return iVar2;
}

Assistant:

TEST_IMPL(fork_timer) {
  /* Timers continue to work after we fork. */

  /*
   * Establish the loop before we fork to make sure that it
   * has state to get reset after the fork.
   */
  pid_t child_pid;

  run_timer_loop_once();
  child_pid = fork();
  ASSERT(child_pid != -1);

  if (child_pid != 0) {
    /* parent */
    assert_wait_child(child_pid);
  } else {
    /* child */
    ASSERT(0 == uv_loop_fork(uv_default_loop()));
    run_timer_loop_once();
  }

  MAKE_VALGRIND_HAPPY();
  return 0;
}